

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O0

bool anon_unknown.dwarf_60e82::FileInputNodeTask::isResultValid
               (BuildEngine *engine,BuildNode *node,BuildValue *value)

{
  bool bVar1;
  BuildSystemImpl *this;
  FileSystem *fileSystem;
  FileInfo *this_00;
  bool local_81;
  undefined1 local_78 [8];
  FileInfo info;
  BuildValue *value_local;
  BuildNode *node_local;
  BuildEngine *engine_local;
  
  info.checksum.bytes._24_8_ = value;
  this = getBuildSystem(engine);
  fileSystem = BuildSystemImpl::getFileSystem(this);
  llbuild::buildsystem::BuildNode::getFileInfo((FileInfo *)local_78,node,fileSystem);
  bVar1 = llbuild::basic::FileInfo::isMissing((FileInfo *)local_78);
  if (bVar1) {
    engine_local._7_1_ =
         llbuild::buildsystem::BuildValue::isMissingInput((BuildValue *)info.checksum.bytes._24_8_);
  }
  else {
    bVar1 = llbuild::buildsystem::BuildValue::isExistingInput
                      ((BuildValue *)info.checksum.bytes._24_8_);
    local_81 = false;
    if (bVar1) {
      this_00 = llbuild::buildsystem::BuildValue::getOutputInfo
                          ((BuildValue *)info.checksum.bytes._24_8_);
      local_81 = llbuild::basic::FileInfo::operator==(this_00,(FileInfo *)local_78);
    }
    engine_local._7_1_ = local_81;
  }
  return engine_local._7_1_;
}

Assistant:

static bool isResultValid(BuildEngine& engine, const BuildNode& node,
                            const BuildValue& value) {
    // The result is valid if the existence matches the value type and the file
    // information remains the same.
    //
    // FIXME: This is inefficient, we will end up doing the stat twice, once
    // when we check the value for up to dateness, and once when we "build" the
    // output.
    //
    // We can solve this by caching ourselves but I wonder if it is something
    // the engine should support more naturally. In practice, this is unlikely
    // to be very performance critical in practice because this is only
    // redundant in the case where we have never built the node before (or need
    // to rebuild it), and thus the additional stat is only one small part of
    // the work we need to perform.
    auto info = node.getFileInfo(
        getBuildSystem(engine).getFileSystem());
    if (info.isMissing()) {
      return value.isMissingInput();
    } else {
      return value.isExistingInput() && value.getOutputInfo() == info;
    }
  }